

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLReaderTest_ReadSumExpr_Test::TestBody(NLReaderTest_ReadSumExpr_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  Type in_stack_fffffffffffffe4c;
  AssertionResult *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  undefined1 local_141 [33];
  string local_120 [38];
  byte local_fa;
  undefined1 local_f9 [33];
  AssertionResult local_d8 [2];
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  AssertionResult local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
             (allocator<char> *)in_stack_fffffffffffffe50);
  std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
             (allocator<char> *)in_stack_fffffffffffffe50);
  ReadNL(gtest_ar.message_.ptr_,(bool)gtest_ar._7_1_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    testing::AssertionResult::failure_message((AssertionResult *)0x151caa);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x151d07);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151d5f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
               (allocator<char> *)in_stack_fffffffffffffe50);
    std::allocator<char>::~allocator((allocator<char> *)local_f9);
    local_fa = 0;
    uVar2 = testing::internal::AlwaysTrue();
    if ((bool)uVar2) {
      in_stack_fffffffffffffe50 = (AssertionResult *)local_141;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe58),
                 (allocator<char> *)in_stack_fffffffffffffe50);
      ReadNL(gtest_ar.message_.ptr_,(bool)gtest_ar._7_1_);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string((string *)(local_141 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_141);
    }
    bVar1 = (local_fa & 1) != 0;
    if (!bVar1) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffe50,
                 (char (*) [109])CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    std::__cxx11::string::~string((string *)(local_f9 + 1));
    if (bVar1) goto LAB_00152208;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe50);
  testing::AssertionResult::failure_message((AssertionResult *)0x152165);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
  testing::Message::~Message((Message *)0x1521c0);
LAB_00152208:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x152215);
  return;
}

Assistant:

TEST(NLReaderTest, ReadSumExpr) {
  EXPECT_READ("c0: sum(v4, 5, v1);", "C0\no54\n3\nv4\nn5\nv1\n");
  EXPECT_READ_ERROR("C0\no54\n2\nv4\nn5\n", "(input):19:1: too few arguments");
}